

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void rollback_without_seqtree(bool multi_kv)

{
  fdb_status fVar1;
  int iVar2;
  size_t metalen;
  char *pcVar3;
  uint64_t *in_stack_00000bd8;
  fdb_snapshot_info_t **in_stack_00000be0;
  fdb_file_handle *in_stack_00000be8;
  void *meta;
  fdb_kvs_handle *in_stack_fffffffffffffa78;
  fdb_file_handle *in_stack_fffffffffffffa80;
  fdb_iterator *in_stack_fffffffffffffa88;
  size_t in_stack_fffffffffffffaa0;
  undefined1 *apuStack_538 [5];
  fdb_doc **in_stack_fffffffffffffaf0;
  fdb_iterator *in_stack_fffffffffffffaf8;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_kvs_handle *snap_db;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char kv_name [8];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  uint64_t num_markers;
  fdb_snapshot_info_t *markers;
  fdb_status status;
  fdb_doc **doc;
  fdb_kvs_handle **db;
  fdb_file_handle *dbfile;
  int num_kvs;
  int num_commits;
  int n;
  int r;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  bool multi_kv_local;
  
  apuStack_538[3] = (undefined1 *)0x1227c0;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  apuStack_538[3] = (undefined1 *)0x1227cd;
  memleak_start();
  dbfile._0_4_ = 3;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.purging_interval = 1;
  fconfig.encryption_key.bytes[0x1c] = '\0';
  fconfig.encryption_key.bytes[0x1d] = '\0';
  fconfig.encryption_key.bytes[0x1e] = '\0';
  fconfig.encryption_key.bytes[0x1f] = '\0';
  fconfig._180_4_ = 0;
  fconfig.wal_flush_before_commit = false;
  fconfig.compactor_sleep_duration._0_1_ = multi_kv;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open((fdb_file_handle **)bodybuf._88_8_,(char *)bodybuf._80_8_,(fdb_config *)bodybuf._72_8_);
  if (multi_kv) {
    for (num_commits = 0; num_commits < 3; num_commits = num_commits + 1) {
      sprintf((char *)&fconfig.num_blocks_readahead,"kv%d",(ulong)(uint)num_commits);
      fdb_kvs_open((fdb_file_handle *)fconfig._232_8_,(fdb_kvs_handle **)fconfig.log_msg_level,
                   fconfig.breakpad_minidump_dir,(fdb_kvs_config *)fconfig.num_keeping_headers);
    }
  }
  else {
    dbfile._0_4_ = 1;
    fdb_kvs_open_default
              (in_stack_fffffffffffffa80,(fdb_kvs_handle **)in_stack_fffffffffffffa78,
               (fdb_kvs_config *)0x122908);
  }
  for (n = 0; n < 5; n = n + 1) {
    for (r = 0; r < 10; r = r + 1) {
      sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)r);
      sprintf(bodybuf + 0xf8,"meta-%d-%d",(ulong)(uint)n,(ulong)(uint)r);
      sprintf(kv_name,"body-%d-%d",(ulong)(uint)n,(ulong)(uint)r);
      apuStack_538[4] = &stack0xfffffffffffffa78 + (long)r * 8;
      in_stack_fffffffffffffaf0 = (fdb_doc **)(metabuf + 0xf8);
      in_stack_fffffffffffffaf8 = (fdb_iterator *)strlen(metabuf + 0xf8);
      strlen(bodybuf + 0xf8);
      meta = (void *)0x1229f1;
      metalen = strlen(kv_name);
      fdb_doc_create((fdb_doc **)in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                     (size_t)in_stack_fffffffffffffa78,meta,metalen,(void *)0x122a28,
                     in_stack_fffffffffffffaa0);
      for (num_commits = 0; num_commits < (int)dbfile; num_commits = num_commits + 1) {
        fdb_set((fdb_kvs_handle *)apuStack_538[num_commits],
                *(fdb_doc **)(&stack0xfffffffffffffa78 + (long)r * 8));
      }
      fdb_doc_free((fdb_doc *)0x122a7d);
    }
    if (n % 2 == 0) {
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffffa78,'\0');
    }
    else {
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffffa78,'\0');
    }
  }
  fVar1 = fdb_get_all_snap_markers(in_stack_00000be8,in_stack_00000be0,in_stack_00000bd8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x148d);
    rollback_without_seqtree::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x148d,"void rollback_without_seqtree(bool)");
    }
  }
  fVar1 = fdb_rollback((fdb_kvs_handle **)fconfig.compaction_cb,fconfig._80_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1491);
    rollback_without_seqtree::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1491,"void rollback_without_seqtree(bool)");
    }
  }
  num_commits = 0;
  do {
    if ((int)dbfile <= num_commits) {
      num_commits = 0;
      do {
        if ((int)dbfile <= num_commits) {
          fVar1 = fdb_rollback_all((fdb_file_handle *)keybuf._152_8_,keybuf._144_8_);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x14c1);
            rollback_without_seqtree::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x14c1,"void rollback_without_seqtree(bool)");
            }
          }
          fVar1 = fdb_free_snap_markers
                            ((fdb_snapshot_info_t *)in_stack_fffffffffffffa88,
                             (uint64_t)in_stack_fffffffffffffa80);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x14c4);
            rollback_without_seqtree::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x14c4,"void rollback_without_seqtree(bool)");
            }
          }
          fdb_close((fdb_file_handle *)in_stack_fffffffffffffa78);
          fdb_shutdown();
          memleak_end();
          pcVar3 = "single kv mode:";
          if (multi_kv) {
            pcVar3 = "multiple kv mode:";
          }
          sprintf(kv_name,"rollback without seqtree in %s",pcVar3);
          if (rollback_without_seqtree::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n",kv_name);
          }
          else {
            fprintf(_stderr,"%s PASSED\n",kv_name);
          }
          return;
        }
        fVar1 = fdb_kvs_close(in_stack_fffffffffffffa78);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x14bd);
          rollback_without_seqtree::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x14bd,"void rollback_without_seqtree(bool)");
          }
        }
        num_commits = num_commits + 1;
      } while( true );
    }
    fVar1 = fdb_snapshot_open((fdb_kvs_handle *)bodybuf._224_8_,(fdb_kvs_handle **)bodybuf._216_8_,
                              bodybuf._208_8_);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1499);
      rollback_without_seqtree::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1499,"void rollback_without_seqtree(bool)");
      }
    }
    fVar1 = fdb_iterator_init((fdb_kvs_handle *)iterator,(fdb_iterator **)&rdoc,(void *)0x0,0,
                              (void *)0x0,0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x149d);
      rollback_without_seqtree::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x149d,"void rollback_without_seqtree(bool)");
      }
    }
    r = 0;
    do {
      fVar1 = fdb_iterator_get(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x14a1);
        rollback_without_seqtree::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x14a1,"void rollback_without_seqtree(bool)");
        }
      }
      sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)r);
      if (num_commits == 0) {
        sprintf(bodybuf + 0xf8,"meta-1-%d",(ulong)(uint)r);
        sprintf(kv_name,"body-1-%d",(ulong)(uint)r);
      }
      else {
        sprintf(bodybuf + 0xf8,"meta-%d-%d",4,(ulong)(uint)r);
        sprintf(kv_name,"body-%d-%d",4,(ulong)(uint)r);
      }
      iVar2 = memcmp(pvRam0000000000000020,metabuf + 0xf8,sRam0000000000000000);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",metabuf + 0xf8,
                pvRam0000000000000020,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x14ab);
        rollback_without_seqtree::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x14ab,"void rollback_without_seqtree(bool)");
      }
      iVar2 = memcmp(pvRam0000000000000038,bodybuf + 0xf8,sRam0000000000000008);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf + 0xf8,
                pvRam0000000000000038,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x14ac);
        rollback_without_seqtree::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x14ac,"void rollback_without_seqtree(bool)");
      }
      iVar2 = memcmp(pvRam0000000000000040,kv_name,sRam0000000000000010);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",kv_name,pvRam0000000000000040,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x14ad);
        rollback_without_seqtree::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x14ad,"void rollback_without_seqtree(bool)");
      }
      fdb_doc_free((fdb_doc *)0x122fbd);
      r = r + 1;
      fVar1 = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffffa78);
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (r != 10) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x14b2);
      rollback_without_seqtree::__test_pass = 0;
      if (r != 10) {
        __assert_fail("i==n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x14b2,"void rollback_without_seqtree(bool)");
      }
    }
    fVar1 = fdb_iterator_close(in_stack_fffffffffffffa88);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x14b4);
      rollback_without_seqtree::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x14b4,"void rollback_without_seqtree(bool)");
      }
    }
    fVar1 = fdb_kvs_close(in_stack_fffffffffffffa78);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x14b7);
      rollback_without_seqtree::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x14b7,"void rollback_without_seqtree(bool)");
      }
    }
    num_commits = num_commits + 1;
  } while( true );
}

Assistant:

void rollback_without_seqtree(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int n = 10;
    int num_commits = 5, num_kvs = 3;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_snapshot_info_t *markers;
    uint64_t num_markers;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.multi_kv_instances = multi_kv;
    // for creating the strict number of snapshots, disable block reusing
    fconfig.block_reusing_threshold = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_NOT_USE;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    // Load documents mulitple times
    for (j=0; j < num_commits; ++j) {
        for (i=0; i<n; i++){
            sprintf(keybuf, "key%d", i);
            sprintf(metabuf, "meta-%d-%d", j, i);
            sprintf(bodybuf, "body-%d-%d", j, i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                           (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
            for (r = 0; r < num_kvs; ++r) {
                fdb_set(db[r], doc[i]);
            }
            fdb_doc_free(doc[i]);
        }
        if (j % 2 == 0) {
            fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        } else {
            fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        }
    }

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Rollback the first KV store to the second commit point
    status = fdb_rollback(&db[0], markers[3].kvs_markers[0].seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_handle *snap_db;
    fdb_iterator *iterator;
    fdb_doc *rdoc = NULL;
    // Create an in-memory snapshot for each KV store and verify all the keys.
    for (r = 0; r < num_kvs; ++r) {
        status = fdb_snapshot_open(db[r], &snap_db, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Verify all the keys in the snapshot
        status = fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        i=0;
        do {
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            sprintf(keybuf, "key%d", i);
            if (r == 0) {
                // The first KV store should only have KV items from the second commit.
                sprintf(metabuf, "meta-1-%d", i);
                sprintf(bodybuf, "body-1-%d", i);
            } else {
                sprintf(metabuf, "meta-%d-%d", num_commits - 1, i);
                sprintf(bodybuf, "body-%d-%d", num_commits - 1, i);
            }
            TEST_CMP(rdoc->key, keybuf, rdoc->keylen);
            TEST_CMP(rdoc->meta, metabuf, rdoc->metalen);
            TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
            fdb_doc_free(rdoc);
            rdoc = NULL;
            i++;
        } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        TEST_CHK(i==n);
        status = fdb_iterator_close(iterator);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        status = fdb_kvs_close(snap_db);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // Close all the KV store handles
    for (r = 0; r < num_kvs; ++r) {
        status = fdb_kvs_close(db[r]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // Rollback all the KV stores to the second commit point
    status = fdb_rollback_all(dbfile, markers[3].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback without seqtree in %s",
            multi_kv ? "multiple kv mode:" : "single kv mode:");
    TEST_RESULT(bodybuf);
}